

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::FlushLogFiles(int min_severity)

{
  LogDestination *pLVar1;
  int i;
  
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)log_mutex);
  for (; min_severity < 4; min_severity = min_severity + 1) {
    pLVar1 = log_destination(min_severity);
    if (pLVar1 != (LogDestination *)0x0) {
      (*pLVar1->logger_->_vptr_Logger[3])();
    }
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(i);
    if (log != NULL) {
      log->logger_->Flush();
    }
  }
}